

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_parse
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *input,size_t inputlen)

{
  int iVar1;
  undefined1 local_88 [8];
  secp256k1_ge Q;
  size_t inputlen_local;
  uchar *input_local;
  secp256k1_pubkey *pubkey_local;
  secp256k1_context *ctx_local;
  
  Q._80_8_ = inputlen;
  if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"pubkey != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    memset(pubkey,0,0x40);
    if (input == (uchar *)0x0) {
      secp256k1_callback_call(&ctx->illegal_callback,"input != NULL");
      ctx_local._4_4_ = 0;
    }
    else {
      iVar1 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_88,input,Q._80_8_);
      if (iVar1 == 0) {
        ctx_local._4_4_ = 0;
      }
      else {
        iVar1 = secp256k1_ge_is_in_correct_subgroup((secp256k1_ge *)local_88);
        if (iVar1 == 0) {
          ctx_local._4_4_ = 0;
        }
        else {
          secp256k1_pubkey_save(pubkey,(secp256k1_ge *)local_88);
          secp256k1_ge_clear((secp256k1_ge *)local_88);
          ctx_local._4_4_ = 1;
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ec_pubkey_parse(const secp256k1_context* ctx, secp256k1_pubkey* pubkey, const unsigned char *input, size_t inputlen) {
    secp256k1_ge Q;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(input != NULL);
    if (!secp256k1_eckey_pubkey_parse(&Q, input, inputlen)) {
        return 0;
    }
    if (!secp256k1_ge_is_in_correct_subgroup(&Q)) {
        return 0;
    }
    secp256k1_pubkey_save(pubkey, &Q);
    secp256k1_ge_clear(&Q);
    return 1;
}